

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void depspawn::wait_for_subtasks(bool priority)

{
  byte in_DIL;
  long *in_FS_OFFSET;
  Observer o;
  Workitem *cur_father;
  Observer *in_stack_000000d0;
  Observer OStack_28;
  Workitem *local_10;
  undefined1 local_1;
  
  local_1 = in_DIL & 1;
  local_10 = *(Workitem **)(*in_FS_OFFSET + -8);
  if (local_10 == (Workitem *)0x0) {
    wait_for_all();
  }
  else {
    Observer::Observer(&OStack_28,(bool)local_1,local_10);
    Observer::~Observer(in_stack_000000d0);
  }
  return;
}

Assistant:

void wait_for_subtasks(bool priority)
  {
    internal::Workitem * cur_father = enum_thr_spec_father;
    
    //fprintf(stderr, "WFS %s\n", (cur_father == nullptr) ? "0" : "nested");
    
    if (cur_father == nullptr) {
      wait_for_all();
    } else {
      Observer o(priority, cur_father);
    }
  }